

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFMatrix.cpp
# Opt level: O1

void __thiscall PDFMatrix::PDFMatrix(PDFMatrix *this,PDFMatrix *inOther)

{
  this->a = inOther->a;
  this->b = inOther->b;
  this->c = inOther->c;
  this->d = inOther->d;
  this->e = inOther->e;
  this->f = inOther->f;
  return;
}

Assistant:

PDFMatrix::PDFMatrix(const PDFMatrix& inOther) {
    a = inOther.a;
    b = inOther.b;
    c = inOther.c;
    d = inOther.d;
    e = inOther.e;
    f = inOther.f;
}